

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::LoadObj(attrib_t *attrib,
                     vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     string *err,istream *inStream,MaterialReader *readMatFn,bool triangulate)

{
  byte bVar1;
  byte bVar2;
  pointer pvVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pfVar6;
  pointer pfVar7;
  undefined1 auVar8 [16];
  vertex_index *pvVar9;
  vertex_index *pvVar10;
  pointer pfVar11;
  pointer pfVar12;
  pointer pfVar13;
  pointer pfVar14;
  pointer pfVar15;
  pointer pfVar16;
  pointer pfVar17;
  pointer pfVar18;
  pointer pvVar19;
  pointer pvVar20;
  _Alloc_hider _Var21;
  pointer paVar22;
  pointer paVar23;
  pointer puVar24;
  pointer puVar25;
  pointer piVar26;
  pointer piVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  bool bVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  size_t sVar33;
  iterator iVar34;
  mapped_type *pmVar35;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  mapped_type mVar36;
  byte *pbVar37;
  size_type sVar38;
  int iVar39;
  pointer pvVar40;
  long lVar41;
  int iVar42;
  size_type sVar43;
  int material_id;
  byte *pbVar44;
  ulong uVar45;
  real_t rVar46;
  vertex_index vi;
  real_t z;
  real_t r;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  faceGroup;
  real_t b;
  real_t g;
  string linebuf;
  string name;
  real_t x;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> tags;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  stringstream errss;
  byte *local_590;
  undefined1 local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_548;
  size_type local_540;
  ulong local_538;
  real_t local_52c;
  pointer local_528;
  iterator iStack_520;
  pointer local_518;
  pointer local_508;
  iterator iStack_500;
  pointer local_4f8;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  local_4e8;
  pointer local_4c8;
  iterator iStack_4c0;
  pointer local_4b8;
  pointer local_4a8;
  iterator iStack_4a0;
  pointer local_498;
  real_t local_490;
  real_t local_48c;
  ios_base *local_488;
  string local_480;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *local_460;
  istream *local_458;
  string local_450;
  shape_t local_430;
  MaterialReader *local_3b0;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  vector<int,_std::allocator<int>_> local_388;
  vector<float,_std::allocator<float>_> vStack_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> vStack_340;
  ios_base aiStack_328 [272];
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> local_218;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *local_1f8;
  attrib_t *local_1f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1e8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_460 = shapes;
  local_3b0 = readMatFn;
  local_1f8 = materials;
  local_1f0 = attrib;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_4f8 = (pointer)0x0;
  local_508 = (pointer)0x0;
  iStack_500._M_current = (pointer)0x0;
  local_518 = (pointer)0x0;
  local_528 = (pointer)0x0;
  iStack_520._M_current = (pointer)0x0;
  local_498 = (pointer)0x0;
  local_4a8 = (pointer)0x0;
  iStack_4a0._M_current = (pointer)0x0;
  local_4b8 = (pointer)0x0;
  local_4c8 = (pointer)0x0;
  iStack_4c0._M_current = (pointer)0x0;
  local_218.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  local_450._M_string_length = 0;
  local_450.field_2._M_local_buf[0] = '\0';
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_430.name._M_dataplus._M_p = (pointer)&local_430.name.field_2;
  local_430.name._M_string_length = 0;
  local_430.name.field_2._M_local_buf[0] = '\0';
  local_430.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_430.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_430.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_430.mesh.num_face_vertices.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_430.mesh.num_face_vertices.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_430.mesh.num_face_vertices.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  local_480._M_string_length = 0;
  local_480.field_2._M_local_buf[0] = '\0';
  local_488 = aiStack_328;
  material_id = -1;
  local_458 = inStream;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0011c5e1:
  iVar30 = std::istream::peek();
  if (iVar30 != -1) {
    safeGetline(inStream,&local_480);
    _Var21._M_p = local_480._M_dataplus._M_p;
    if (local_480._M_string_length == 0) goto LAB_0011c5e1;
    if (local_480._M_dataplus._M_p[local_480._M_string_length - 1] == '\n') {
      local_480._M_string_length = local_480._M_string_length - 1;
      local_480._M_dataplus._M_p[local_480._M_string_length] = '\0';
      if (local_480._M_string_length == 0) goto LAB_0011c5e1;
    }
    if (local_480._M_dataplus._M_p[local_480._M_string_length - 1] == '\r') {
      local_480._M_string_length = local_480._M_string_length - 1;
      local_480._M_dataplus._M_p[local_480._M_string_length] = '\0';
      if (local_480._M_string_length == 0) goto LAB_0011c5e1;
    }
    sVar33 = strspn(local_480._M_dataplus._M_p," \t");
    pbVar44 = (byte *)(_Var21._M_p + sVar33);
    local_590 = pbVar44;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      __assert_fail("token",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/tinyobjloader/tiny_obj_loader.h"
                    ,0x620,
                    "bool tinyobj::LoadObj(attrib_t *, std::vector<shape_t> *, std::vector<material_t> *, std::string *, std::istream *, MaterialReader *, bool)"
                   );
    }
    bVar1 = *pbVar44;
    if (bVar1 == 0x66) {
      if ((pbVar44[1] == 0x20) || (pbVar44[1] == 9)) {
        local_590 = pbVar44 + 2;
        local_548 = err;
        sVar33 = strspn((char *)local_590," \t");
        pbVar44 = pbVar44 + sVar33 + 2;
        local_3a8._0_8_ = (pointer)0x0;
        local_3a8._8_8_ = (vertex_index *)0x0;
        local_398._M_allocated_capacity = 0;
        local_590 = pbVar44;
        std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::reserve
                  ((vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)
                   local_3a8,3);
        do {
          if ((*pbVar44 < 0xe) && ((0x2401U >> (*pbVar44 & 0x1f) & 1) != 0)) {
            local_588._0_8_ = (pointer)0x0;
            local_588._8_8_ = (pointer)0x0;
            local_588._16_8_ = (pointer)0x0;
            local_590 = pbVar44;
            std::
            vector<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>,std::allocator<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>>>
            ::emplace_back<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>>
                      ((vector<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>,std::allocator<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>>>
                        *)&local_4e8,
                       (vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)
                       local_588);
            err = local_548;
            if ((pointer)local_588._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_588._0_8_,local_588._16_8_ - local_588._0_8_);
            }
            pvVar3 = local_4e8.
                     super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].
                     super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar9 = local_4e8.
                     super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].
                     super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pvVar10 = local_4e8.
                      super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                      super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_4e8.
            super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_3a8._0_8_;
            local_4e8.
            super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3a8._8_8_;
            local_4e8.
            super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)local_398._M_allocated_capacity;
            bVar29 = true;
            local_3a8._0_8_ = pvVar3;
            local_3a8._8_8_ = pvVar9;
            local_398._M_allocated_capacity = (size_type)pvVar10;
            goto LAB_0011c9a2;
          }
          local_588._0_8_ = (pointer)0xffffffffffffffff;
          local_588._8_4_ = 0xffffffff;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = (long)iStack_520._M_current - (long)local_528 >> 2;
          local_538 = SUB168(auVar8 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
          uVar45 = (long)iStack_4a0._M_current - (long)local_4a8;
          iVar31 = atoi((char *)pbVar44);
          iVar42 = -1;
          iVar39 = -1;
          local_540 = CONCAT44(local_540._4_4_,iVar31);
          if (iVar31 < 1) {
            if (iVar31 == 0) goto LAB_0011c9c4;
            iVar39 = (int)((ulong)((long)iStack_500._M_current - (long)local_508 >> 2) / 3);
          }
          sVar33 = strcspn((char *)pbVar44,"/ \t\r");
          pbVar37 = pbVar44 + sVar33;
          if (pbVar44[sVar33] == 0x2f) {
            local_538 = local_538 >> 1;
            if (pbVar37[1] == 0x2f) {
              pbVar37 = pbVar37 + 2;
              iVar32 = atoi((char *)pbVar37);
              iVar42 = -1;
              iVar31 = -1;
              if ((iVar32 < 1) && (iVar31 = (int)local_538, iVar32 == 0)) goto LAB_0011c9c4;
              iVar31 = iVar31 + iVar32;
            }
            else {
              pbVar44 = pbVar37 + 1;
              iVar32 = atoi((char *)pbVar44);
              iVar31 = -1;
              iVar42 = -1;
              if ((iVar32 < 1) && (iVar42 = (int)(uVar45 >> 3), iVar32 == 0)) goto LAB_0011c9c4;
              iVar42 = iVar42 + iVar32;
              sVar33 = strcspn((char *)pbVar44,"/ \t\r");
              pbVar37 = pbVar44 + sVar33;
              if (pbVar44[sVar33] != 0x2f) goto LAB_0011c897;
              pbVar37 = pbVar37 + 1;
              iVar32 = atoi((char *)pbVar37);
              iVar31 = -1;
              if ((iVar32 < 1) && (iVar31 = (int)local_538, iVar32 == 0)) goto LAB_0011c9c4;
              iVar31 = iVar31 + iVar32;
            }
            sVar33 = strcspn((char *)pbVar37,"/ \t\r");
            pbVar37 = pbVar37 + sVar33;
          }
          else {
            iVar31 = -1;
          }
LAB_0011c897:
          local_588._4_4_ = iVar42;
          local_588._0_4_ = iVar39 + (int)local_540;
          local_588._8_4_ = iVar31;
          if (local_3a8._8_8_ == local_398._M_allocated_capacity) {
            std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>::
            _M_realloc_insert<tinyobj::vertex_index_const&>
                      ((vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>> *)
                       local_3a8,(iterator)local_3a8._8_8_,(vertex_index *)local_588);
          }
          else {
            *(int *)(local_3a8._8_8_ + 8) = iVar31;
            *(undefined8 *)local_3a8._8_8_ = local_588._0_8_;
            local_3a8._8_8_ = local_3a8._8_8_ + 0xc;
          }
          sVar33 = strspn((char *)pbVar37," \t\r");
          pbVar44 = pbVar37 + sVar33;
        } while( true );
      }
    }
    else {
      if ((bVar1 == 0) || (bVar1 == 0x23)) goto LAB_0011c5e1;
      if (bVar1 == 0x76) {
        bVar2 = pbVar44[1];
        if (bVar2 < 0x6e) {
          if ((bVar2 == 9) || (bVar2 == 0x20)) {
            local_590 = pbVar44 + 2;
            rVar46 = parseReal((char **)&local_590,0.0);
            local_3a8._0_4_ = rVar46;
            rVar46 = parseReal((char **)&local_590,0.0);
            local_588._0_4_ = rVar46;
            rVar46 = parseReal((char **)&local_590,0.0);
            local_568._M_dataplus._M_p._0_4_ = rVar46;
            local_52c = parseReal((char **)&local_590,1.0);
            local_48c = parseReal((char **)&local_590,1.0);
            local_490 = parseReal((char **)&local_590,1.0);
            if (iStack_500._M_current == local_4f8) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_508,iStack_500,
                         (float *)local_3a8);
            }
            else {
              *iStack_500._M_current = (float)local_3a8._0_4_;
              iStack_500._M_current = iStack_500._M_current + 1;
            }
            if (iStack_500._M_current == local_4f8) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_508,iStack_500,
                         (float *)local_588);
            }
            else {
              *iStack_500._M_current = (float)local_588._0_4_;
              iStack_500._M_current = iStack_500._M_current + 1;
            }
            if (iStack_500._M_current == local_4f8) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_508,iStack_500,
                         (float *)&local_568);
            }
            else {
              *iStack_500._M_current = local_568._M_dataplus._M_p._0_4_;
              iStack_500._M_current = iStack_500._M_current + 1;
            }
            if (iStack_4c0._M_current == local_4b8) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_4c8,iStack_4c0,&local_52c);
            }
            else {
              *iStack_4c0._M_current = local_52c;
              iStack_4c0._M_current = iStack_4c0._M_current + 1;
            }
            if (iStack_4c0._M_current == local_4b8) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_4c8,iStack_4c0,&local_48c);
            }
            else {
              *iStack_4c0._M_current = local_48c;
              iStack_4c0._M_current = iStack_4c0._M_current + 1;
            }
            if (iStack_4c0._M_current == local_4b8) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_4c8,iStack_4c0,&local_490);
            }
            else {
              *iStack_4c0._M_current = local_490;
              iStack_4c0._M_current = iStack_4c0._M_current + 1;
            }
            goto LAB_0011c5e1;
          }
        }
        else if (bVar2 == 0x6e) {
          if ((pbVar44[2] == 0x20) || (pbVar44[2] == 9)) {
            local_590 = pbVar44 + 3;
            rVar46 = parseReal((char **)&local_590,0.0);
            local_3a8._0_4_ = rVar46;
            rVar46 = parseReal((char **)&local_590,0.0);
            local_588._0_4_ = rVar46;
            rVar46 = parseReal((char **)&local_590,0.0);
            local_568._M_dataplus._M_p._0_4_ = rVar46;
            if (iStack_520._M_current == local_518) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_528,iStack_520,
                         (float *)local_3a8);
            }
            else {
              *iStack_520._M_current = (float)local_3a8._0_4_;
              iStack_520._M_current = iStack_520._M_current + 1;
            }
            if (iStack_520._M_current == local_518) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_528,iStack_520,
                         (float *)local_588);
            }
            else {
              *iStack_520._M_current = (float)local_588._0_4_;
              iStack_520._M_current = iStack_520._M_current + 1;
            }
            if (iStack_520._M_current == local_518) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_528,iStack_520,
                         (float *)&local_568);
            }
            else {
              *iStack_520._M_current = local_568._M_dataplus._M_p._0_4_;
              iStack_520._M_current = iStack_520._M_current + 1;
            }
            goto LAB_0011c5e1;
          }
        }
        else if ((bVar2 == 0x74) && ((pbVar44[2] == 0x20 || (pbVar44[2] == 9)))) {
          local_590 = pbVar44 + 3;
          rVar46 = parseReal((char **)&local_590,0.0);
          local_3a8._0_4_ = rVar46;
          rVar46 = parseReal((char **)&local_590,0.0);
          local_588._0_4_ = rVar46;
          if (iStack_4a0._M_current == local_498) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_4a8,iStack_4a0,
                       (float *)local_3a8);
          }
          else {
            *iStack_4a0._M_current = (float)local_3a8._0_4_;
            iStack_4a0._M_current = iStack_4a0._M_current + 1;
          }
          if (iStack_4a0._M_current == local_498) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_4a8,iStack_4a0,
                       (float *)local_588);
          }
          else {
            *iStack_4a0._M_current = (float)local_588._0_4_;
            iStack_4a0._M_current = iStack_4a0._M_current + 1;
          }
          goto LAB_0011c5e1;
        }
      }
    }
    iVar30 = strncmp((char *)pbVar44,"usemtl",6);
    if ((iVar30 == 0) && ((pbVar44[6] == 0x20 || (pbVar44[6] == 9)))) {
      pbVar44 = pbVar44 + 7;
      local_590 = pbVar44;
      std::__cxx11::stringstream::stringstream((stringstream *)local_3a8);
      sVar33 = strlen((char *)pbVar44);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_3a8 + 0x10),(char *)pbVar44,sVar33);
      std::__cxx11::stringbuf::str();
      iVar34 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&local_1e8,(key_type *)local_588);
      if ((_Rb_tree_header *)iVar34._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
        mVar36 = -1;
      }
      else {
        pmVar35 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                *)&local_1e8,(key_type *)local_588);
        mVar36 = *pmVar35;
      }
      if ((mVar36 != material_id) &&
         (exportFaceGroupToShape
                    (&local_430,&local_4e8,&local_218,material_id,&local_450,triangulate),
         pvVar20 = local_4e8.
                   super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
         pvVar19 = local_4e8.
                   super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pvVar40 = local_4e8.
                   super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, material_id = mVar36, pbVar28 = err,
         local_4e8.
         super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         local_4e8.
         super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)) {
        do {
          local_548 = pbVar28;
          pvVar3 = (pvVar40->
                   super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (pvVar3 != (pointer)0x0) {
            operator_delete(pvVar3,(long)(pvVar40->
                                         super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar3);
          }
          pvVar40 = pvVar40 + 1;
          pbVar28 = local_548;
        } while (pvVar40 != pvVar20);
        local_4e8.
        super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar19;
        err = local_548;
      }
LAB_0011d992:
      if ((pointer)local_588._0_8_ != (pointer)(local_588 + 0x10)) {
        operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a8);
      std::ios_base::~ios_base(local_488);
      goto LAB_0011c5e1;
    }
    iVar30 = strncmp((char *)pbVar44,"mtllib",6);
    if ((iVar30 == 0) && ((pbVar44[6] == 0x20 || (pbVar44[6] == 9)))) {
      if (local_3b0 == (MaterialReader *)0x0) goto LAB_0011c5e1;
      local_590 = pbVar44 + 7;
      local_568._M_dataplus._M_p = (pointer)0x0;
      local_568._M_string_length = 0;
      local_568.field_2._M_allocated_capacity = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3a8,(char *)local_590,(allocator<char> *)local_588);
      SplitString((string *)local_3a8,(char)&local_568,elems);
      if ((pointer)local_3a8._0_8_ != (pointer)(local_3a8 + 0x10)) {
        operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_allocated_capacity + 1));
      }
      if (local_568._M_dataplus._M_p == (pointer)local_568._M_string_length) {
        if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (err,"WARN: Looks like empty filename for mtllib. Use default material. \n");
        }
      }
      else {
        lVar41 = 0;
        uVar45 = 0;
        do {
          local_3a8._0_8_ = local_3a8 + 0x10;
          local_3a8._8_8_ = (vertex_index *)0x0;
          local_398._M_allocated_capacity = local_398._M_allocated_capacity & 0xffffffffffffff00;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_588,*(char **)(local_568._M_dataplus._M_p + lVar41),
                     (allocator<char> *)&local_52c);
          iVar30 = (*local_3b0->_vptr_MaterialReader[2])
                             (local_3b0,(string *)local_588,local_1f8,&local_1e8,local_3a8);
          if ((pointer)local_588._0_8_ != (pointer)(local_588 + 0x10)) {
            operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
          }
          if ((err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
             ((vertex_index *)local_3a8._8_8_ != (vertex_index *)0x0)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(err,(char *)local_3a8._0_8_,local_3a8._8_8_);
          }
          if ((pointer)local_3a8._0_8_ != (pointer)(local_3a8 + 0x10)) {
            operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_allocated_capacity + 1));
          }
          if ((char)iVar30 != '\0') goto LAB_0011db42;
          uVar45 = uVar45 + 1;
          lVar41 = lVar41 + 0x20;
        } while (uVar45 < (ulong)((long)(local_568._M_string_length -
                                        (long)local_568._M_dataplus._M_p) >> 5));
        if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (err,"WARN: Failed to load material file(s). Use default material.\n");
        }
      }
    }
    else {
      if (bVar1 == 0x74) {
        if ((pbVar44[1] == 0x20) || (pbVar44[1] == 9)) {
          local_3a8._0_8_ = local_3a8 + 0x10;
          local_3a8._8_8_ = (vertex_index *)0x0;
          local_398._M_allocated_capacity = local_398._M_allocated_capacity & 0xffffffffffffff00;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_590 = pbVar44 + 2;
          local_568._M_string_length = 0;
          local_568.field_2._M_allocated_capacity =
               local_568.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
          sVar33 = strspn((char *)local_590," \t");
          pbVar44 = pbVar44 + sVar33 + 2;
          local_590 = pbVar44;
          sVar33 = strcspn((char *)pbVar44," \t\r");
          pbVar37 = pbVar44 + sVar33;
          local_588._0_8_ = (pointer)(local_588 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_588,pbVar44,pbVar37);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588)
          ;
          if ((pointer)local_588._0_8_ != (pointer)(local_588 + 0x10)) {
            operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
          }
          local_590 = pbVar37;
          local_548 = err;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                     &local_568);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          sVar33 = strspn((char *)pbVar37," \t");
          pbVar37 = pbVar37 + sVar33;
          local_590 = pbVar37;
          iVar30 = atoi((char *)pbVar37);
          sVar33 = strcspn((char *)pbVar37,"/ \t\r");
          pbVar44 = pbVar37 + sVar33;
          if (pbVar37[sVar33] == 0x2f) {
            local_590 = pbVar44 + 1;
            sVar33 = strspn((char *)local_590," \t");
            pbVar44 = pbVar44 + sVar33 + 1;
            local_590 = pbVar44;
            iVar31 = atoi((char *)pbVar44);
            local_538 = CONCAT44(local_538._4_4_,iVar31);
            sVar33 = strcspn((char *)pbVar44,"/ \t\r");
            pbVar37 = pbVar44 + sVar33;
            if (pbVar44[sVar33] == 0x2f) {
              local_590 = pbVar37 + 1;
              sVar33 = strspn((char *)local_590," \t");
              pbVar37 = pbVar37 + sVar33 + 1;
              local_590 = pbVar37;
              iVar31 = atoi((char *)pbVar37);
              sVar33 = strcspn((char *)pbVar37," \t\r");
              local_540 = (size_type)iVar31;
              local_590 = pbVar37 + sVar33;
            }
            else {
              local_540 = 0;
              local_590 = pbVar37;
            }
          }
          else {
            local_540 = 0;
            local_538 = local_538 & 0xffffffff00000000;
            local_590 = pbVar44;
          }
          pbVar44 = local_590;
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)(local_3a8 + 0x20),(long)iVar30);
          piVar26 = local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (iVar30 != 0) {
            sVar43 = 0;
            do {
              sVar33 = strspn((char *)pbVar44," \t");
              pbVar44 = pbVar44 + sVar33;
              iVar31 = atoi((char *)pbVar44);
              sVar33 = strcspn((char *)pbVar44," \t\r");
              pbVar44 = pbVar44 + sVar33;
              piVar26[sVar43] = iVar31;
              sVar43 = sVar43 + 1;
            } while ((long)iVar30 != sVar43);
          }
          sVar43 = (size_type)(int)local_538;
          local_590 = pbVar44;
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)(local_3a8 + 0x38),sVar43);
          if ((int)local_538 != 0) {
            sVar38 = 0;
            do {
              rVar46 = parseReal((char **)&local_590,0.0);
              vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[sVar38] = rVar46;
              sVar38 = sVar38 + 1;
            } while (sVar43 != sVar38);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_3a8 + 0x50),local_540);
          pbVar44 = local_590;
          if (local_540 != 0) {
            lVar41 = 0;
            do {
              local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
              local_568._M_string_length = 0;
              local_568.field_2._M_allocated_capacity =
                   local_568.field_2._M_allocated_capacity & 0xffffffffffffff00;
              sVar33 = strspn((char *)pbVar44," \t");
              pbVar37 = pbVar44 + sVar33;
              sVar33 = strcspn((char *)pbVar37," \t\r");
              pbVar44 = pbVar37 + sVar33;
              local_588._0_8_ = (pointer)(local_588 + 0x10);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_588,pbVar37,pbVar44);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&local_568,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_588);
              if ((pointer)local_588._0_8_ != (pointer)(local_588 + 0x10)) {
                operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&((local_358.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar41),&local_568);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_568._M_dataplus._M_p != &local_568.field_2) {
                operator_delete(local_568._M_dataplus._M_p,
                                local_568.field_2._M_allocated_capacity + 1);
              }
              lVar41 = lVar41 + 0x20;
              local_540 = local_540 - 1;
            } while (local_540 != 0);
          }
          local_590 = pbVar44;
          std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::push_back
                    (&local_218,(value_type *)local_3a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_3a8 + 0x50));
          if (vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)vStack_370.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_370.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          inStream = local_458;
          err = local_548;
          if (local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((pointer)local_3a8._0_8_ != (pointer)(local_3a8 + 0x10)) {
            operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_allocated_capacity + 1));
          }
        }
        goto LAB_0011c5e1;
      }
      if (bVar1 == 0x6f) {
        if ((pbVar44[1] == 0x20) || (pbVar44[1] == 9)) {
          bVar29 = exportFaceGroupToShape
                             (&local_430,&local_4e8,&local_218,material_id,&local_450,triangulate);
          if (bVar29) {
            std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                      (local_460,&local_430);
          }
          if (local_4e8.
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_4e8.
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            LoadObj();
          }
          local_3a8._0_8_ = local_3a8 + 0x10;
          local_398._M_allocated_capacity = 0;
          local_398._8_8_ = 0;
          local_3a8._8_8_ = (vertex_index *)0x0;
          vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_430.name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8)
          ;
          paVar23 = local_430.mesh.indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          paVar22 = local_430.mesh.indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_430.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_430.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          local_430.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
          local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          if (paVar22 != (pointer)0x0) {
            operator_delete(paVar22,(long)paVar23 - (long)paVar22);
          }
          puVar25 = local_430.mesh.num_face_vertices.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          puVar24 = local_430.mesh.num_face_vertices.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_430.mesh.num_face_vertices.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_430.mesh.num_face_vertices.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          local_430.mesh.num_face_vertices.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
          vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pointer)puVar24 != (pointer)0x0) {
            operator_delete(puVar24,(long)puVar25 - (long)puVar24);
          }
          piVar27 = local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          piVar26 = local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_358.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_358.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_358.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pointer)piVar26 != (pointer)0x0) {
            operator_delete(piVar26,(long)piVar27 - (long)piVar26);
          }
          local_588._16_8_ =
               local_430.mesh.tags.
               super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_588._8_8_ =
               local_430.mesh.tags.
               super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_588._0_8_ =
               local_430.mesh.tags.
               super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
          _M_impl.super__Vector_impl_data._M_start =
               vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector
                    ((vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)local_588);
          std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector(&vStack_340);
          if (local_358.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_358.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_358.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_358.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)vStack_370.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_370.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((pointer)local_3a8._0_8_ != (pointer)(local_3a8 + 0x10)) {
            operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_allocated_capacity + 1));
          }
          pbVar44 = pbVar44 + 2;
          local_590 = pbVar44;
          std::__cxx11::stringstream::stringstream((stringstream *)local_3a8);
          sVar33 = strlen((char *)pbVar44);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_3a8 + 0x10),(char *)pbVar44,sVar33);
          std::__cxx11::stringbuf::str();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_450,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588)
          ;
          goto LAB_0011d992;
        }
        goto LAB_0011c5e1;
      }
      if ((bVar1 != 0x67) || ((pbVar44[1] != 0x20 && (pbVar44[1] != 9)))) goto LAB_0011c5e1;
      exportFaceGroupToShape(&local_430,&local_4e8,&local_218,material_id,&local_450,triangulate);
      if (local_430.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_430.mesh.indices.
          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                  (local_460,&local_430);
      }
      local_3a8._0_8_ = local_3a8 + 0x10;
      local_398._M_allocated_capacity = 0;
      local_398._8_8_ = 0;
      local_3a8._8_8_ = (vertex_index *)0x0;
      vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_430.name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
      paVar23 = local_430.mesh.indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      paVar22 = local_430.mesh.indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_430.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_430.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_430.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if (paVar22 != (pointer)0x0) {
        operator_delete(paVar22,(long)paVar23 - (long)paVar22);
      }
      puVar25 = local_430.mesh.num_face_vertices.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      puVar24 = local_430.mesh.num_face_vertices.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_430.mesh.num_face_vertices.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_430.mesh.num_face_vertices.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_430.mesh.num_face_vertices.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((pointer)puVar24 != (pointer)0x0) {
        operator_delete(puVar24,(long)puVar25 - (long)puVar24);
      }
      piVar27 = local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      piVar26 = local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_358.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_358.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_358.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pointer)piVar26 != (pointer)0x0) {
        operator_delete(piVar26,(long)piVar27 - (long)piVar26);
      }
      local_588._16_8_ =
           local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_588._8_8_ =
           local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_588._0_8_ =
           local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
      _M_impl.super__Vector_impl_data._M_start =
           vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_430.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_340.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector
                ((vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)local_588);
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector(&vStack_340);
      if (local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_358.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_358.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_548 = err;
      if ((pointer)local_3a8._0_8_ != (pointer)(local_3a8 + 0x10)) {
        operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_allocated_capacity + 1));
      }
      pvVar20 = local_4e8.
                super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar19 = local_4e8.
                super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar40 = local_4e8.
                super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_4e8.
          super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_4e8.
          super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pvVar3 = (pvVar40->
                   super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (pvVar3 != (pointer)0x0) {
            operator_delete(pvVar3,(long)(pvVar40->
                                         super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar3);
          }
          pvVar40 = pvVar40 + 1;
        } while (pvVar40 != pvVar20);
        local_4e8.
        super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar19;
      }
      local_568._M_dataplus._M_p = (pointer)0x0;
      local_568._M_string_length = 0;
      local_568.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_568,2);
      err = local_548;
      while ((0xd < *pbVar44 || ((0x2401U >> (*pbVar44 & 0x1f) & 1) == 0))) {
        local_588._0_8_ = local_588 + 0x10;
        local_588._8_8_ = (pointer)0x0;
        local_588._16_8_ = local_588._16_8_ & 0xffffffffffffff00;
        sVar33 = strspn((char *)pbVar44," \t");
        pbVar44 = pbVar44 + sVar33;
        sVar33 = strcspn((char *)pbVar44," \t\r");
        pbVar37 = pbVar44 + sVar33;
        local_3a8._0_8_ = local_3a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,pbVar44,pbVar37);
        LoadObj();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_568,(value_type *)local_588);
        sVar33 = strspn((char *)pbVar37," \t\r");
        if ((pointer)local_588._0_8_ != (pointer)(local_588 + 0x10)) {
          operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
        }
        pbVar44 = pbVar37 + sVar33;
      }
      local_590 = pbVar44;
      if ((pointer)local_568._M_string_length == local_568._M_dataplus._M_p) {
        __assert_fail("names.size() > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/tinyobjloader/tiny_obj_loader.h"
                      ,0x6c8,
                      "bool tinyobj::LoadObj(attrib_t *, std::vector<shape_t> *, std::vector<material_t> *, std::string *, std::istream *, MaterialReader *, bool)"
                     );
      }
      if (local_568._M_string_length - (long)local_568._M_dataplus._M_p < 0x21) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_450,0,local_450._M_string_length,"",0);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_450,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_568._M_dataplus._M_p + 0x20));
      }
    }
LAB_0011db42:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_568);
    goto LAB_0011c5e1;
  }
  bVar29 = exportFaceGroupToShape
                     (&local_430,&local_4e8,&local_218,material_id,&local_450,triangulate);
  if ((bVar29) ||
     (local_430.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_430.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
              (local_460,&local_430);
  }
  pvVar20 = local_4e8.
            super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar19 = local_4e8.
            super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar40 = local_4e8.
            super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_4e8.
      super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_4e8.
      super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pvVar3 = (pvVar40->
               super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (pvVar3 != (pointer)0x0) {
        operator_delete(pvVar3,(long)(pvVar40->
                                     super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      pvVar40 = pvVar40 + 1;
    } while (pvVar40 != pvVar20);
    local_4e8.
    super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar19;
  }
  if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (err,(char *)local_3a8._0_8_,local_3a8._8_8_);
    if ((pointer)local_3a8._0_8_ != (pointer)(local_3a8 + 0x10)) {
      operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_allocated_capacity + 1));
    }
  }
  pfVar4 = (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_4f8;
  pfVar11 = (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar12 = (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = local_508;
  (local_1f0->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = iStack_500._M_current;
  pfVar5 = (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_518;
  pfVar13 = (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar14 = (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = local_528;
  (local_1f0->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = iStack_520._M_current;
  pfVar6 = (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_498;
  pfVar15 = (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar16 = (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = local_4a8;
  (local_1f0->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = iStack_4a0._M_current;
  pfVar7 = (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_4b8;
  pfVar17 = (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar18 = (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = local_4c8;
  (local_1f0->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = iStack_4c0._M_current;
  local_528 = pfVar13;
  iStack_520._M_current = pfVar14;
  local_518 = pfVar5;
  local_508 = pfVar11;
  iStack_500._M_current = pfVar12;
  local_4f8 = pfVar4;
  local_4c8 = pfVar17;
  iStack_4c0._M_current = pfVar18;
  local_4b8 = pfVar7;
  local_4a8 = pfVar15;
  iStack_4a0._M_current = pfVar16;
  local_498 = pfVar6;
LAB_0011df54:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,
                    CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                             local_480.field_2._M_local_buf[0]) + 1);
  }
  std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector(&local_430.mesh.tags);
  if ((pointer)local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_430.mesh.num_face_vertices.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.mesh.num_face_vertices.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_430.mesh.num_face_vertices.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.mesh.num_face_vertices.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_430.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.mesh.indices.
                    super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_430.mesh.indices.
                          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.mesh.indices.
                          super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430.name._M_dataplus._M_p != &local_430.name.field_2) {
    operator_delete(local_430.name._M_dataplus._M_p,
                    CONCAT71(local_430.name.field_2._M_allocated_capacity._1_7_,
                             local_430.name.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                             local_450.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ::~vector(&local_4e8);
  std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector(&local_218);
  if (local_4c8 != (pointer)0x0) {
    operator_delete(local_4c8,(long)local_4b8 - (long)local_4c8);
  }
  if (local_4a8 != (pointer)0x0) {
    operator_delete(local_4a8,(long)local_498 - (long)local_4a8);
  }
  if (local_528 != (pointer)0x0) {
    operator_delete(local_528,(long)local_518 - (long)local_528);
  }
  if (local_508 != (pointer)0x0) {
    operator_delete(local_508,(long)local_4f8 - (long)local_508);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return iVar30 == -1;
LAB_0011c9c4:
  err = local_548;
  if (local_548 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (local_548,0,local_548->_M_string_length,
               "Failed parse `f\' line(e.g. zero value for face index).\n",0x37);
  }
  bVar29 = false;
LAB_0011c9a2:
  inStream = local_458;
  if ((pointer)local_3a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3a8._0_8_,local_398._M_allocated_capacity - local_3a8._0_8_);
  }
  if (!bVar29) goto LAB_0011df54;
  goto LAB_0011c5e1;
}

Assistant:

bool LoadObj(attrib_t *attrib, std::vector<shape_t> *shapes,
             std::vector<material_t> *materials, std::string *err,
             std::istream *inStream, MaterialReader *readMatFn /*= NULL*/,
             bool triangulate) {
  std::stringstream errss;

  std::vector<real_t> v;
  std::vector<real_t> vn;
  std::vector<real_t> vt;
  std::vector<real_t> vc;
  std::vector<tag_t> tags;
  std::vector<std::vector<vertex_index> > faceGroup;
  std::string name;

  // material
  std::map<std::string, int> material_map;
  int material = -1;

  shape_t shape;

  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      real_t x, y, z;
      real_t r, g, b;
      parseVertexWithColor(&x, &y, &z, &r, &g, &b, &token);
      v.push_back(x);
      v.push_back(y);
      v.push_back(z);

      vc.push_back(r);
      vc.push_back(g);
      vc.push_back(b);
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      vn.push_back(x);
      vn.push_back(y);
      vn.push_back(z);
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y;
      parseReal2(&x, &y, &token);
      vt.push_back(x);
      vt.push_back(y);
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      std::vector<vertex_index> face;
      face.reserve(3);

      while (!IS_NEW_LINE(token[0])) {
        vertex_index vi;
        if (!parseTriple(&token, static_cast<int>(v.size() / 3),
                         static_cast<int>(vn.size() / 3),
                         static_cast<int>(vt.size() / 2), &vi)) {
          if (err) {
            (*err) = "Failed parse `f' line(e.g. zero value for face index).\n";
          }
          return false;
        }

        face.push_back(vi);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      // replace with emplace_back + std::move on C++11
      faceGroup.push_back(std::vector<vertex_index>());
      faceGroup[faceGroup.size() - 1].swap(face);

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      if (material_map.find(namebuf) != material_map.end()) {
        newMaterialId = material_map[namebuf];
      } else {
        // { error!! material not found }
      }

      if (newMaterialId != material) {
        // Create per-face material. Thus we don't add `shape` to `shapes` at
        // this time.
        // just clear `faceGroup` after `exportFaceGroupToShape()` call.
        exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                               triangulate);
        faceGroup.clear();
        material = newMaterialId;
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (err) {
            (*err) +=
                "WARN: Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), materials,
                                   &material_map, &err_mtl);
            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;  // This should be warn message.
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (err) {
              (*err) +=
                  "WARN: Failed to load material file(s). Use default "
                  "material.\n";
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      // flush previous face group.
      bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                        triangulate);
      (void)ret;  // return value not used.

      if (shape.mesh.indices.size() > 0) {
        shapes->push_back(shape);
      }

      shape = shape_t();

      // material = -1;
      faceGroup.clear();

      std::vector<std::string> names;
      names.reserve(2);

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      // names[0] must be 'g', so skip the 0th element.
      if (names.size() > 1) {
        name = names[1];
      } else {
        name = "";
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // flush previous face group.
      bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                        triangulate);
      if (ret) {
        shapes->push_back(shape);
      }

      // material = -1;
      faceGroup.clear();
      shape = shape_t();

      // @todo { multiple object name? }
      token += 2;
      std::stringstream ss;
      ss << token;
      name = ss.str();

      continue;
    }

    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;

      tag.name = parseString(&token);

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = parseInt(&token);
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        tag.stringValues[i] = parseString(&token);
      }

      tags.push_back(tag);
    }

    // Ignore unknown command.
  }

  bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                    triangulate);
  // exportFaceGroupToShape return false when `usemtl` is called in the last
  // line.
  // we also add `shape` to `shapes` when `shape.mesh` has already some
  // faces(indices)
  if (ret || shape.mesh.indices.size()) {
    shapes->push_back(shape);
  }
  faceGroup.clear();  // for safety

  if (err) {
    (*err) += errss.str();
  }

  attrib->vertices.swap(v);
  attrib->normals.swap(vn);
  attrib->texcoords.swap(vt);
  attrib->colors.swap(vc);

  return true;
}